

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ResultBuilder::captureExpression(ResultBuilder *this)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  IResultCapture *pIVar4;
  IMutableContext *pIVar5;
  undefined4 extraout_var;
  AssertionResult result;
  long *local_d0;
  AssertionResult local_c8;
  
  build(&local_c8,this);
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[2])(pIVar4,&local_c8);
  if ((((undefined1)local_c8.m_resultData.resultType & FailureBit) != Ok) &&
     ((local_c8.m_info.resultDisposition & SuppressFail) == Normal)) {
    pIVar5 = getCurrentMutableContext();
    (*(pIVar5->super_IContext)._vptr_IContext[6])(&local_d0,pIVar5);
    cVar1 = (**(code **)(*local_d0 + 0x40))();
    if (local_d0 != (long *)0x0) {
      (**(code **)(*local_d0 + 0x18))();
    }
    if (cVar1 != '\0') {
      this->m_shouldDebugBreak = true;
    }
    pIVar5 = getCurrentMutableContext();
    iVar3 = (*(pIVar5->super_IContext)._vptr_IContext[3])(pIVar5);
    bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar3));
    if ((bVar2 | (this->m_assertionInfo).resultDisposition == Normal) == 1) {
      this->m_shouldThrow = true;
    }
  }
  AssertionResult::~AssertionResult(&local_c8);
  return;
}

Assistant:

void ResultBuilder::captureExpression() {
        AssertionResult result = build();
        getResultCapture().assertionEnded( result );

        if( !result.isOk() ) {
            if( getCurrentContext().getConfig()->shouldDebugBreak() )
                m_shouldDebugBreak = true;
            if( getCurrentContext().getRunner()->aborting() || m_assertionInfo.resultDisposition == ResultDisposition::Normal )
                m_shouldThrow = true;
        }
    }